

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O3

BOOL __thiscall
Js::RecyclableObject::Equals
          (RecyclableObject *this,Var aRight,BOOL *value,ScriptContext *requestContext)

{
  ulong uVar1;
  long lVar2;
  PropertyRecord *pPVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  int32 iVar7;
  uint uVar8;
  undefined4 *puVar9;
  RecyclableObject *pRVar10;
  RecyclableObject *pRVar11;
  JavascriptTypedNumber<unsigned_long> *pJVar12;
  JavascriptTypedNumber<long> *pJVar13;
  JavascriptString *aLeft;
  JavascriptString *aRight_00;
  JavascriptBoolean *pJVar14;
  JavascriptSymbolObject *pJVar15;
  JavascriptSymbol *pJVar16;
  PropertyRecord *pPVar17;
  char *message;
  ulong uVar18;
  char *error;
  Type TVar19;
  Type TVar20;
  uint lineNumber;
  Type TVar21;
  int iVar22;
  uint uVar23;
  double dVar24;
  double dVar25;
  RecyclableObject *local_40;
  
  if (this == (RecyclableObject *)aRight) {
    *value = 1;
    return 1;
  }
  TVar19 = ((this->type).ptr)->typeId;
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00dcf541;
    *puVar9 = 0;
LAB_00dce7e6:
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00dcf541;
      *puVar9 = 0;
    }
    TVar21 = ((pRVar10->type).ptr)->typeId;
    if (((int)TVar21 < 0x58) || (BVar6 = IsExternal(pRVar10), BVar6 != 0)) goto LAB_00dce8bd;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar5) {
LAB_00dcf541:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  else {
    if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
      TVar21 = TypeIds_FirstNumberType;
      if ((((ulong)aRight & 0xffff000000000000) == 0x1000000000000) ||
         (TVar21 = TypeIds_Number, (Var)0x3ffffffffffff < aRight)) goto LAB_00dce8bd;
      goto LAB_00dce7e6;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar5) goto LAB_00dcf541;
    TVar21 = TypeIds_FirstNumberType;
  }
  *puVar9 = 0;
LAB_00dce8bd:
  uVar8 = 0;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pRVar10 = this;
  local_40 = (RecyclableObject *)aRight;
LAB_00dce8db:
  uVar23 = ~uVar8;
LAB_00dce8e1:
  iVar22 = (int)pRVar10;
  switch(TVar19) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    if (TVar21 < TypeIds_BigInt) {
      if ((0x118U >> (TVar21 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
      goto switchD_00dceb66_caseD_0;
      if ((3U >> (TVar21 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
        *value = 1;
        return 1;
      }
    }
    this = VarTo<Js::RecyclableObject>(local_40);
    goto LAB_00dcefe5;
  case TypeIds_Boolean:
    goto switchD_00dce8f6_caseD_2;
  case TypeIds_FirstNumberType:
    switch(TVar21) {
    case TypeIds_Undefined:
    case TypeIds_Null:
    case TypeIds_Symbol:
      goto switchD_00dceb66_caseD_0;
    case TypeIds_Boolean:
    case TypeIds_String:
      dVar25 = (double)iVar22;
      dVar24 = JavascriptConversion::ToNumber(local_40,requestContext);
      goto LAB_00dcefb2;
    case TypeIds_FirstNumberType:
      uVar8 = (uint)(pRVar10 == local_40);
      goto LAB_00dceff0;
    case TypeIds_Number:
      dVar25 = (double)iVar22;
      goto LAB_00dcef9b;
    case TypeIds_Int64Number:
      iVar7 = TaggedInt::ToInt32(pRVar10);
      pJVar13 = VarTo<Js::JavascriptTypedNumber<long>>(local_40);
      bVar5 = pJVar13->m_value == (long)iVar7;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x23b;
      break;
    case TypeIds_LastNumberType:
      iVar7 = TaggedInt::ToInt32(pRVar10);
      pJVar13 = VarTo<Js::JavascriptTypedNumber<long>>(local_40);
      bVar5 = pJVar13->m_value == (long)iVar7;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x244;
      break;
    default:
      goto switchD_00dceb66_caseD_5;
    }
    break;
  case TypeIds_Number:
    switch(TVar21) {
    case TypeIds_Undefined:
    case TypeIds_Null:
    case TypeIds_Symbol:
      goto switchD_00dceb66_caseD_0;
    case TypeIds_Boolean:
    case TypeIds_String:
      goto switchD_00dceb66_caseD_2;
    case TypeIds_FirstNumberType:
      dVar25 = JavascriptNumber::GetValue(pRVar10);
      dVar24 = (double)(int)local_40;
      goto LAB_00dcefb2;
    case TypeIds_Number:
      dVar25 = JavascriptNumber::GetValue(pRVar10);
LAB_00dcef9b:
      dVar24 = JavascriptNumber::GetValue(local_40);
      goto LAB_00dcefb2;
    default:
      goto switchD_00dceb66_caseD_5;
    }
  case TypeIds_Int64Number:
    switch(TVar21) {
    case TypeIds_FirstNumberType:
      pJVar13 = VarTo<Js::JavascriptTypedNumber<long>>(pRVar10);
      lVar2 = pJVar13->m_value;
      iVar7 = TaggedInt::ToInt32(local_40);
      bVar5 = lVar2 == iVar7;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x25c;
      goto LAB_00dcef75;
    case TypeIds_Number:
      pJVar13 = VarTo<Js::JavascriptTypedNumber<long>>(pRVar10);
      dVar25 = (double)pJVar13->m_value;
      goto LAB_00dcef9b;
    case TypeIds_Int64Number:
    case TypeIds_LastNumberType:
      pJVar12 = (JavascriptTypedNumber<unsigned_long> *)
                VarTo<Js::JavascriptTypedNumber<long>>(pRVar10);
LAB_00dcee8d:
      TVar20 = pJVar12->m_value;
      pJVar12 = (JavascriptTypedNumber<unsigned_long> *)
                VarTo<Js::JavascriptTypedNumber<long>>(local_40);
LAB_00dceeb1:
      bVar5 = TVar20 == pJVar12->m_value;
      goto LAB_00dceeb7;
    }
switchD_00dcedc1_default:
    pRVar10 = (RecyclableObject *)
              JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(pRVar10,requestContext);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00dcf541;
      *puVar9 = 0;
LAB_00dcea0f:
      pRVar11 = UnsafeVarTo<Js::RecyclableObject>(pRVar10);
      if (pRVar11 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00dcf541;
        *puVar9 = 0;
      }
      TVar19 = ((pRVar11->type).ptr)->typeId;
      if ((0x57 < (int)TVar19) && (BVar6 = IsExternal(pRVar11), BVar6 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
LAB_00dceab3:
        if (bVar5 != false) {
          *puVar9 = 0;
          goto LAB_00dceae6;
        }
        goto LAB_00dcf541;
      }
    }
    else {
      if (((ulong)pRVar10 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pRVar10 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        TVar19 = TypeIds_FirstNumberType;
        goto LAB_00dceab3;
      }
      TVar19 = TypeIds_FirstNumberType;
      if ((((ulong)pRVar10 & 0xffff000000000000) != 0x1000000000000) &&
         (TVar19 = TypeIds_Number, pRVar10 < (RecyclableObject *)0x4000000000000))
      goto LAB_00dcea0f;
    }
LAB_00dceae6:
    uVar23 = uVar23 - 1;
    if (uVar23 == 0xfffffffd) goto switchD_00dceb66_caseD_0;
    goto LAB_00dce8e1;
  case TypeIds_LastNumberType:
    switch(TVar21) {
    case TypeIds_FirstNumberType:
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar10);
      TVar20 = pJVar12->m_value;
      iVar7 = TaggedInt::ToInt32(local_40);
      bVar5 = TVar20 == (long)iVar7;
      *value = (uint)(bVar5 && -1 < iVar7);
      if (!bVar5 || -1 >= iVar7) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x27d;
      break;
    case TypeIds_Number:
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar10);
      uVar1 = pJVar12->m_value;
      uVar18 = (ulong)((uint)uVar1 & 1) | uVar1 >> 1;
      if (-1 < (long)uVar1) {
        uVar18 = uVar1;
      }
      dVar24 = (double)(long)uVar18;
      dVar25 = dVar24 + dVar24;
      if (-1 < (long)uVar1) {
        dVar25 = dVar24;
      }
      dVar24 = JavascriptNumber::GetValue(local_40);
      goto LAB_00dcefb2;
    case TypeIds_Int64Number:
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar10);
      goto LAB_00dcee8d;
    case TypeIds_LastNumberType:
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar10);
      TVar20 = pJVar12->m_value;
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(local_40);
      goto LAB_00dceeb1;
    default:
      goto switchD_00dcedc1_default;
    }
    break;
  case TypeIds_String:
    if (TypeIds_Symbol < TVar21) goto switchD_00dceb66_caseD_5;
    if ((0x1cU >> (TVar21 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) goto LAB_00dcf03c;
    if ((0x103U >> (TVar21 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
    goto switchD_00dceb66_caseD_0;
    if (TVar21 == TypeIds_String) {
      aLeft = UnsafeVarTo<Js::JavascriptString>(pRVar10);
      aRight_00 = UnsafeVarTo<Js::JavascriptString>(local_40);
      bVar5 = JavascriptString::Equals(aLeft,aRight_00);
      uVar8 = (uint)bVar5;
      goto LAB_00dceff0;
    }
    goto switchD_00dceb66_caseD_5;
  case TypeIds_Symbol:
    if ((int)TVar21 < 7) {
      if (TVar21 < TypeIds_Int64Number) goto switchD_00dceb66_caseD_0;
      goto switchD_00dceb66_caseD_5;
    }
    if (TVar21 == TypeIds_String) goto switchD_00dceb66_caseD_0;
    if (TVar21 == TypeIds_SymbolObject) {
      pJVar15 = UnsafeVarTo<Js::JavascriptSymbolObject>(local_40);
      pRVar11 = (RecyclableObject *)JavascriptSymbolObject::Unwrap(pJVar15);
      *value = (uint)(pRVar10 == pRVar11);
      pJVar16 = UnsafeVarTo<Js::JavascriptSymbol>(pRVar10);
      pPVar3 = (pJVar16->propertyRecordUsageCache).propertyRecord.ptr;
      pJVar15 = UnsafeVarTo<Js::JavascriptSymbolObject>(local_40);
      pJVar16 = (pJVar15->value).ptr;
      if (pJVar16 == (JavascriptSymbol *)0x0) {
        pPVar17 = (PropertyRecord *)0x0;
      }
      else {
        pPVar17 = (pJVar16->propertyRecordUsageCache).propertyRecord.ptr;
      }
      if (*value == (uint)(pPVar3 == pPVar17)) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = 
      "((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value)"
      ;
      message = 
      "(UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value"
      ;
      lineNumber = 0x2e5;
    }
    else {
      if (TVar21 != TypeIds_Symbol) goto switchD_00dceb66_caseD_5;
      *value = (uint)(pRVar10 == local_40);
      pJVar16 = UnsafeVarTo<Js::JavascriptSymbol>(pRVar10);
      pPVar3 = (pJVar16->propertyRecordUsageCache).propertyRecord.ptr;
      pJVar16 = UnsafeVarTo<Js::JavascriptSymbol>(local_40);
      if (*value == (uint)(pPVar3 == (pJVar16->propertyRecordUsageCache).propertyRecord.ptr)) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = 
      "((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value)"
      ;
      message = 
      "(UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value"
      ;
      lineNumber = 0x2e1;
    }
    break;
  default:
    if (TVar21 < TypeIds_BigInt) {
      if ((0x19cU >> (TVar21 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
      goto switchD_00dcedc1_default;
      if ((3U >> (TVar21 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
LAB_00dcefe5:
        uVar8 = ((this->type).ptr)->flags & 2;
LAB_00dceff0:
        *value = uVar8;
        return 1;
      }
    }
    goto switchD_00dceb66_caseD_0;
  }
LAB_00dcef75:
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                              ,lineNumber,error,message);
  if (bVar5) {
    *puVar9 = 0;
    return 1;
  }
  goto LAB_00dcf541;
switchD_00dceb66_caseD_2:
  if (pRVar10 < (RecyclableObject *)0x4000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'"
                               );
    if (!bVar5) goto LAB_00dcf541;
    *puVar9 = 0;
  }
  dVar25 = (double)((ulong)pRVar10 ^ 0xfffc000000000000);
  if (((ulong)local_40 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)local_40 & 0xffff000000000000) != 0x1000000000000) goto joined_r0x00dcf310;
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar9 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                              "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
  if (!bVar5) goto LAB_00dcf541;
  *puVar9 = 0;
  goto LAB_00dcf267;
switchD_00dce8f6_caseD_2:
  if (TVar21 < TypeIds_BigInt) {
    if ((0x98U >> (TVar21 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
LAB_00dcf03c:
      if (((ulong)pRVar10 & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)pRVar10 & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)pRVar10 & 0xffff000000000000) == 0x1000000000000) goto LAB_00dcf0ce;
        if (pRVar10 < (RecyclableObject *)0x4000000000000) {
          dVar25 = JavascriptConversion::ToNumber_Full(pRVar10,requestContext);
        }
        else {
          dVar25 = (double)((ulong)pRVar10 ^ 0xfffc000000000000);
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar5) goto LAB_00dcf541;
        *puVar9 = 0;
LAB_00dcf0ce:
        dVar25 = (double)iVar22;
      }
      if (((ulong)local_40 & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)local_40 & 0xffff000000000000) != 0x1000000000000) {
joined_r0x00dcf310:
        if (((ulong)local_40 & 0xffff000000000000) != 0x1000000000000) {
          if (local_40 < (RecyclableObject *)0x4000000000000) {
            dVar24 = JavascriptConversion::ToNumber_Full(local_40,requestContext);
          }
          else {
            dVar24 = (double)((ulong)local_40 ^ 0xfffc000000000000);
          }
          goto LAB_00dcefb2;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar5) goto LAB_00dcf541;
        *puVar9 = 0;
      }
LAB_00dcf267:
      dVar24 = (double)(int)local_40;
LAB_00dcefb2:
      *value = (uint)(dVar25 == dVar24);
      return 1;
    }
    if ((0x103U >> (TVar21 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
    goto switchD_00dceb66_caseD_0;
    if (TVar21 == TypeIds_Boolean) {
      pJVar14 = VarTo<Js::JavascriptBoolean>(pRVar10);
      iVar22 = pJVar14->value;
      pJVar14 = VarTo<Js::JavascriptBoolean>(local_40);
      bVar5 = iVar22 == pJVar14->value;
LAB_00dceeb7:
      *value = (uint)bVar5;
      return 1;
    }
  }
switchD_00dceb66_caseD_5:
  local_40 = (RecyclableObject *)
             JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(local_40,requestContext);
  if (local_40 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00dcf541;
    *puVar9 = 0;
LAB_00dcec90:
    pRVar11 = UnsafeVarTo<Js::RecyclableObject>(local_40);
    if (pRVar11 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00dcf541;
      *puVar9 = 0;
    }
    TVar21 = ((pRVar11->type).ptr)->typeId;
    if (((int)TVar21 < 0x58) || (BVar6 = IsExternal(pRVar11), BVar6 != 0)) goto LAB_00dced71;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
  }
  else {
    if (((ulong)local_40 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)local_40 & 0xffff000000000000) != 0x1000000000000) {
      TVar21 = TypeIds_FirstNumberType;
      if ((((ulong)local_40 & 0xffff000000000000) == 0x1000000000000) ||
         (TVar21 = TypeIds_Number, (RecyclableObject *)0x3ffffffffffff < local_40))
      goto LAB_00dced71;
      goto LAB_00dcec90;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    TVar21 = TypeIds_FirstNumberType;
  }
  if (bVar5 == false) goto LAB_00dcf541;
  *puVar9 = 0;
LAB_00dced71:
  uVar8 = -uVar23;
  if (uVar23 == 0xfffffffe) {
switchD_00dceb66_caseD_0:
    *value = 0;
    return 1;
  }
  goto LAB_00dce8db;
}

Assistant:

BOOL RecyclableObject::Equals(__in Var aRight, __out BOOL* value, ScriptContext * requestContext)
    {
        Var aLeft = this;
        if (aLeft == aRight)
        {
            *value = TRUE;
            return TRUE;
        }

        double dblLeft, dblRight;
        TypeId leftType = this->GetTypeId();
        TypeId rightType = JavascriptOperators::GetTypeId(aRight);
        int redoCount = 0;

    Redo:
        if (redoCount == 2)
        {
            goto ReturnFalse;
        }

        switch (leftType)
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
            switch (rightType)
            {
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Undefined:
            case TypeIds_Null:
                goto ReturnTrue;
            default:
                // Falsy objects are == null and == undefined.
                *value = VarTo<RecyclableObject>(aRight)->GetType()->IsFalsy();
                return TRUE;
            }
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Integer:
                // We already did a check to see if aLeft == aRight above, but we need to check again in case there was a redo.
                *value = aLeft == aRight;
                return TRUE;
            case TypeIds_Int64Number:
            {
                int leftValue = TaggedInt::ToInt32(aLeft);
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = TaggedInt::ToInt32(aLeft);
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/*leftValue >= 0 && */(unsigned __int64)leftValue == rightValue);
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Boolean:
            case TypeIds_String:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;
        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                int rightValue = TaggedInt::ToInt32(aRight);
                *value = leftValue == rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = (double)VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Int64Number:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/* leftValue >= 0 && */(unsigned __int64)leftValue == rightValue);
                return TRUE;
            }
            }
            break;
        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = TaggedInt::ToInt32(aRight);
                // TODO: yongqu to review whether we need to check for neg value
                *value = rightValue >= 0 && leftValue == (unsigned __int64)rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = (double)VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Int64Number:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/* rightValue >= 0 && */leftValue == (unsigned __int64)rightValue);
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                return TRUE;
            }
            }
            break;
        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Integer:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = TaggedInt::ToDouble(aRight);
                goto CompareDoubles;
            case TypeIds_Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Boolean:
            case TypeIds_String:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;
        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_String:
                *value = JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
                return TRUE;
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_Boolean:
                dblLeft = JavascriptConversion::ToNumber(aLeft, requestContext);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
        case TypeIds_Boolean:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Boolean:
                *value = VarTo<JavascriptBoolean>(aLeft)->GetValue() == VarTo<JavascriptBoolean>(aRight)->GetValue();
                return TRUE;
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_String:
                dblLeft = JavascriptConversion::ToNumber(aLeft, requestContext);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;

        case TypeIds_Symbol:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_String:
            case TypeIds_Boolean:
                goto ReturnFalse;
            case TypeIds_Symbol:
                *value = (aLeft == aRight);
                Assert((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value);
                return TRUE;
            case TypeIds_SymbolObject:
                *value = (aLeft == UnsafeVarTo<JavascriptSymbolObject>(aRight)->Unwrap());
                Assert((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value);
                return TRUE;
            default:
                goto RedoRight;
            }
            break;

        case TypeIds_Function:
            if (rightType == TypeIds_Function)
            {
                goto ReturnFalse;
            }
            // Fall through to do normal object comparison on function object.
        default:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
                // Falsy objects are == null and == undefined.
                *value = this->type->IsFalsy();
                return TRUE;
            case TypeIds_Boolean:
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_String:
            case TypeIds_Symbol:
                goto RedoLeft;
            default:
                goto ReturnFalse;
            }
        }

    RedoLeft:
        aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::None>(aLeft, requestContext);
        leftType = JavascriptOperators::GetTypeId(aLeft);
        redoCount++;
        goto Redo;
    RedoRight:
        aRight = JavascriptConversion::ToPrimitive<JavascriptHint::None>(aRight, requestContext);
        rightType = JavascriptOperators::GetTypeId(aRight);
        redoCount++;
        goto Redo;
    CompareDoubles:
        *value = dblLeft == dblRight;
        return TRUE;
    ReturnFalse:
        *value = FALSE;
        return TRUE;
    ReturnTrue:
        *value = TRUE;
        return TRUE;
    }